

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O0

TPZSFMatrix<long_double> * __thiscall
TPZSFMatrix<long_double>::operator+=(TPZSFMatrix<long_double> *this,longdouble value)

{
  longdouble *plVar1;
  int iVar2;
  undefined4 extraout_var;
  TPZSFMatrix<long_double> *in_RDI;
  longdouble in_stack_00000008;
  longdouble *end;
  longdouble *dst;
  longdouble *local_20;
  
  local_20 = in_RDI->fElem;
  plVar1 = in_RDI->fElem;
  iVar2 = (*(in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x4b])();
  while (local_20 < plVar1 + CONCAT44(extraout_var,iVar2)) {
    *local_20 = *local_20 + in_stack_00000008;
    local_20 = local_20 + 1;
  }
  (in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  return in_RDI;
}

Assistant:

TPZSFMatrix<TVar>  &
TPZSFMatrix<TVar> ::operator+=( TVar value )
{
	TVar *dst = fElem;
	TVar *end = &fElem[ Size() ];
	while ( dst < end )
		*dst++ += value;
	this->fDecomposed = 0;
	return( *this );
}